

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feat.c
# Opt level: O2

mfcc_t *** feat_array_alloc(feat_t *fcb,int32 nfr)

{
  int iVar1;
  uint uVar2;
  mfcc_t ***pppmVar3;
  void *pvVar4;
  ulong uVar5;
  ulong uVar6;
  void *pvVar7;
  long lVar8;
  long lVar9;
  int32 iVar10;
  uint32 *puVar11;
  uint uVar12;
  
  if (fcb == (feat_t *)0x0) {
    __assert_fail("fcb",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                  ,0x169,"mfcc_t ***feat_array_alloc(feat_t *, int32)");
  }
  if (nfr < 1) {
    __assert_fail("nfr > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                  ,0x16a,"mfcc_t ***feat_array_alloc(feat_t *, int32)");
  }
  if (fcb->out_dim == 0) {
    __assert_fail("feat_dimension(fcb) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                  ,0x16b,"mfcc_t ***feat_array_alloc(feat_t *, int32)");
  }
  uVar2 = fcb->n_stream;
  uVar5 = 0;
  uVar6 = 0;
  if (0 < (int)uVar2) {
    uVar6 = (ulong)uVar2;
  }
  uVar12 = 0;
  for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
    uVar12 = uVar12 + fcb->stream_len[uVar5];
  }
  if (fcb->out_dim <= uVar12) {
    if (fcb->sv_dim <= (int)uVar12) {
      if (fcb->n_sv != 0) {
        uVar2 = fcb->n_sv;
      }
      pppmVar3 = (mfcc_t ***)
                 __ckd_calloc_2d__((ulong)(uint)nfr,(long)(int)uVar2,8,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                                   ,0x176);
      pvVar4 = __ckd_calloc__((long)(int)(nfr * uVar12),4,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                              ,0x177);
      iVar1 = fcb->n_sv;
      for (uVar5 = 0; uVar5 != (uint)nfr; uVar5 = uVar5 + 1) {
        pvVar7 = (void *)((long)pvVar4 + uVar5 * (long)(int)uVar12 * 4);
        lVar8 = 0;
        lVar9 = 0;
        while( true ) {
          iVar10 = iVar1;
          if (iVar1 == 0) {
            iVar10 = fcb->n_stream;
          }
          if (iVar10 <= lVar9) break;
          *(void **)((long)pppmVar3[uVar5] + lVar8 * 2) = pvVar7;
          puVar11 = &fcb->out_dim;
          if (fcb->lda == (mfcc_t ***)0x0) {
            if (fcb->sv_len == (uint32 *)0x0) {
              puVar11 = (uint32 *)((long)fcb->stream_len + lVar8);
            }
            else {
              puVar11 = fcb->sv_len + lVar9;
            }
          }
          pvVar7 = (void *)((long)pvVar7 + (ulong)*puVar11 * 4);
          lVar9 = lVar9 + 1;
          lVar8 = lVar8 + 4;
        }
      }
      return pppmVar3;
    }
    __assert_fail("k >= fcb->sv_dim",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                  ,0x173,"mfcc_t ***feat_array_alloc(feat_t *, int32)");
  }
  __assert_fail("k >= feat_dimension(fcb)",
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                ,0x172,"mfcc_t ***feat_array_alloc(feat_t *, int32)");
}

Assistant:

mfcc_t ***
feat_array_alloc(feat_t * fcb, int32 nfr)
{
    int32 i, j, k;
    mfcc_t *data, *d, ***feat;

    assert(fcb);
    assert(nfr > 0);
    assert(feat_dimension(fcb) > 0);

    /* Make sure to use the dimensionality of the features *before*
       LDA and subvector projection. */
    k = 0;
    for (i = 0; i < fcb->n_stream; ++i)
        k += fcb->stream_len[i];
    assert(k >= feat_dimension(fcb));
    assert(k >= fcb->sv_dim);

    feat =
        (mfcc_t ***) ckd_calloc_2d(nfr, feat_dimension1(fcb), sizeof(mfcc_t *));
    data = (mfcc_t *) ckd_calloc(nfr * k, sizeof(mfcc_t));

    for (i = 0; i < nfr; i++) {
        d = data + i * k;
        for (j = 0; j < feat_dimension1(fcb); j++) {
            feat[i][j] = d;
            d += feat_dimension2(fcb, j);
        }
    }

    return feat;
}